

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lopcodes.c
# Opt level: O3

void ravi_print_function(membuff_t *mb,Proto *f,int full)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Instruction *pIVar5;
  TString *pTVar6;
  LocVar *pLVar7;
  Upvaldesc *pUVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  Proto *pPVar16;
  TString *pTVar17;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar18;
  undefined8 extraout_RDX_01;
  int iVar19;
  char *pcVar20;
  ulong uVar21;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  byte bVar25;
  long lVar26;
  char *pcVar27;
  
  pTVar17 = (TString *)"=?";
  if (f->source != (TString *)0x0) {
    pTVar17 = f->source + 1;
  }
  cVar1 = *(char *)&pTVar17->next;
  if (cVar1 == '\x1b') {
    pcVar13 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar13 = (char *)((long)&pTVar17->next + 1);
  }
  else {
    pcVar13 = "(string)";
  }
  uVar2 = f->sizep;
  pcVar14 = "function";
  pcVar20 = "s";
  pcVar22 = "s";
  if (f->linedefined == 0) {
    pcVar14 = "main";
  }
  if (f->sizecode == 1) {
    pcVar22 = "";
  }
  membuff_add_fstring(mb,"\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar14,pcVar13,
                      (ulong)(uint)f->linedefined,(ulong)(uint)f->lastlinedefined,
                      (ulong)(uint)f->sizecode,pcVar22,f);
  pcVar13 = "+";
  pcVar14 = "s";
  pcVar22 = "s";
  pcVar27 = "s";
  if (f->is_vararg == '\0') {
    pcVar13 = "";
  }
  if (f->numparams == 1) {
    pcVar14 = "";
  }
  if (f->maxstacksize == 1) {
    pcVar22 = "";
  }
  if (f->sizeupvalues == 1) {
    pcVar27 = "";
  }
  membuff_add_fstring(mb,"%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)f->numparams,pcVar13,
                      pcVar14,(ulong)f->maxstacksize,pcVar22,(ulong)(uint)f->sizeupvalues,pcVar27);
  pcVar13 = "s";
  pcVar14 = "s";
  if (f->sizelocvars == 1) {
    pcVar13 = "";
  }
  if (f->sizek == 1) {
    pcVar14 = "";
  }
  if (f->sizep == 1) {
    pcVar20 = "";
  }
  membuff_add_fstring(mb,"%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)f->sizelocvars,
                      pcVar13,(ulong)(uint)f->sizek,pcVar14,(ulong)(uint)f->sizep,pcVar20);
  iVar3 = f->sizecode;
  if (iVar3 < 1) {
LAB_00134660:
    uVar4 = f->sizek;
    membuff_add_fstring(mb,"constants (%d) for %p:\n",(ulong)uVar4,f);
    if (0 < (int)uVar4) {
      uVar11 = 0;
      do {
        uVar10 = uVar11 + 1;
        membuff_add_fstring(mb,"\t%d\t",(ulong)uVar10);
        PrintConstant(mb,(Proto *)f->k,uVar11);
        membuff_add_fstring(mb,anon_var_dwarf_26f66 + 5);
        uVar11 = uVar10;
      } while (uVar4 != uVar10);
    }
    uVar4 = f->sizelocvars;
    membuff_add_fstring(mb,"locals (%d) for %p:\n",(ulong)uVar4,f);
    if (0 < (long)(int)uVar4) {
      lVar26 = 0x14;
      uVar23 = 0;
      do {
        pLVar7 = f->locvars;
        membuff_add_fstring(mb,"\t%d\t%s\t%d\t%d\n",uVar23 & 0xffffffff,
                            *(long *)((long)pLVar7 + lVar26 + -0x14) + 0x18,
                            (ulong)(*(int *)((long)pLVar7 + lVar26 + -4) + 1),
                            (ulong)(*(int *)((long)&pLVar7->varname + lVar26) + 1));
        uVar23 = uVar23 + 1;
        lVar26 = lVar26 + 0x20;
      } while ((long)(int)uVar4 != uVar23);
    }
    uVar4 = f->sizeupvalues;
    membuff_add_fstring(mb,"upvalues (%d) for %p:\n",(ulong)uVar4,f);
    uVar18 = extraout_RDX;
    if (0 < (long)(int)uVar4) {
      lVar26 = 0x15;
      uVar23 = 0;
      do {
        pUVar8 = f->upvalues;
        lVar9 = *(long *)((long)pUVar8 + lVar26 + -0x15);
        pcVar13 = (char *)(lVar9 + 0x18);
        if (lVar9 == 0) {
          pcVar13 = "-";
        }
        membuff_add_fstring(mb,"\t%d\t%s\t%d\t%d\n",uVar23 & 0xffffffff,pcVar13,
                            (ulong)*(byte *)((long)pUVar8 + lVar26 + -1),
                            (ulong)*(byte *)((long)&pUVar8->name + lVar26));
        uVar23 = uVar23 + 1;
        lVar26 = lVar26 + 0x18;
        uVar18 = extraout_RDX_00;
      } while ((long)(int)uVar4 != uVar23);
    }
    if (0 < (int)uVar2) {
      uVar23 = 0;
      do {
        ravi_print_function(mb,f->p[uVar23],(int)uVar18);
        uVar23 = uVar23 + 1;
        uVar18 = extraout_RDX_01;
      } while (uVar2 != uVar23);
    }
    return;
  }
  iVar19 = 0;
  pIVar5 = f->code;
LAB_0013415c:
  uVar4 = pIVar5[iVar19];
  if (f->lineinfo == (int *)0x0) {
    membuff_add_fstring(mb,"\t%d\t",(ulong)(iVar19 + 1));
LAB_001341c7:
    membuff_add_fstring(mb,"[-]\t");
  }
  else {
    uVar11 = f->lineinfo[iVar19];
    membuff_add_fstring(mb,"\t%d\t",(ulong)(iVar19 + 1));
    if ((int)uVar11 < 1) goto LAB_001341c7;
    membuff_add_fstring(mb,"[%d]\t",(ulong)uVar11);
  }
  uVar10 = uVar4 >> 0x18;
  uVar23 = (ulong)uVar10;
  uVar24 = uVar4 >> 8;
  uVar11 = uVar4 >> 0x10;
  uVar21 = (ulong)(uVar24 & 0x7f);
  uVar12 = uVar11 & 0xff;
  membuff_add_fstring(mb,"%-9s\t",luaP_opnames[uVar4 & 0xff]);
  bVar25 = luaP_opmodes[uVar4 & 0xff];
  switch(bVar25 & 3) {
  case 0:
    membuff_add_fstring(mb,"%d",uVar21);
    if ((bVar25 >> 4 & 3) != 0) {
      uVar15 = uVar23;
      if (((bVar25 >> 4 & 3) == 3) && ((int)uVar4 < 0)) {
        uVar15 = (ulong)(~uVar10 | 0xffffff80);
      }
      membuff_add_fstring(mb," %d",uVar15);
    }
    bVar25 = bVar25 >> 2 & 3;
    if (bVar25 != 0) {
      uVar15 = (ulong)uVar12;
      if ((bVar25 == 3) && (uVar15 = (ulong)uVar12, (uVar4 >> 0x17 & 1) != 0)) {
        uVar15 = (ulong)(~uVar11 | 0xffffff80);
      }
LAB_0013431f:
      pcVar13 = " %d";
      goto LAB_0013433c;
    }
    break;
  case 1:
    membuff_add_fstring(mb,"%d",uVar21);
    if ((bVar25 & 0x30) == 0x10) {
      pcVar13 = " %d";
      uVar15 = (ulong)uVar11;
      goto LAB_0013433c;
    }
    if ((bVar25 & 0x30) == 0x30) {
      uVar15 = (ulong)~uVar11;
      goto LAB_0013431f;
    }
    break;
  case 2:
    membuff_add_fstring(mb,"%d %d",uVar21,(ulong)(uVar11 - 0x8000));
    break;
  case 3:
    pcVar13 = "%d";
    uVar15 = (ulong)~uVar24;
LAB_0013433c:
    membuff_add_fstring(mb,pcVar13,uVar15);
  }
  switch(uVar4 & 0xff) {
  case 1:
    membuff_add_fstring(mb,"\t; ");
    goto LAB_001345ef;
  default:
    goto switchD_00134360_caseD_2;
  case 5:
  case 9:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
    pcVar13 = "\t; %s";
    pTVar17 = f->upvalues[uVar23].name;
    pPVar16 = (Proto *)(pTVar17 + 1);
    if (pTVar17 == (TString *)0x0) {
      pPVar16 = (Proto *)0x159878;
    }
    goto LAB_0013446e;
  case 6:
  case 0x73:
    pTVar6 = f->upvalues[uVar23].name;
    pTVar17 = pTVar6 + 1;
    if (pTVar6 == (TString *)0x0) {
      pTVar17 = (TString *)0x159878;
    }
    membuff_add_fstring(mb,"\t; %s",pTVar17);
    if ((uVar4 >> 0x17 & 1) == 0) break;
    membuff_add_string(mb," ");
    pPVar16 = (Proto *)f->k;
LAB_0013449d:
    uVar11 = uVar11 & 0x7f;
    goto LAB_001345f3;
  case 7:
  case 0xc:
  case 0x50:
  case 0x51:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x71:
    if ((uVar4 >> 0x17 & 1) != 0) {
      membuff_add_fstring(mb,"\t; ");
LAB_0013448f:
      pPVar16 = (Proto *)f->k;
      goto LAB_0013449d;
    }
    goto switchD_00134360_caseD_2;
  case 8:
    pTVar6 = f->upvalues[uVar21].name;
    pTVar17 = pTVar6 + 1;
    if (pTVar6 == (TString *)0x0) {
      pTVar17 = (TString *)0x159878;
    }
    membuff_add_fstring(mb,"\t; %s",pTVar17);
    if ((int)uVar4 < 0) {
      membuff_add_string(mb," ");
      PrintConstant(mb,(Proto *)f->k,uVar10 & 0x7f);
    }
    if ((uVar4 >> 0x17 & 1) != 0) {
      membuff_add_string(mb," ");
      goto LAB_0013448f;
    }
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6c:
  case 0x6f:
  case 0x72:
    if ((uVar4 & 0x80800000) == 0) goto switchD_00134360_caseD_2;
    membuff_add_fstring(mb,"\t; ");
    if ((int)uVar4 < 0) {
      PrintConstant(mb,(Proto *)f->k,uVar10 & 0x7f);
    }
    else {
      membuff_add_fstring(mb,"-");
    }
    membuff_add_string(mb," ");
    if ((uVar4 >> 0x17 & 1) == 0) {
      membuff_add_fstring(mb,"-");
    }
    else {
      PrintConstant(mb,(Proto *)f->k,uVar11 & 0x7f);
    }
    break;
  case 0x1e:
  case 0x27:
  case 0x28:
  case 0x2a:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
    membuff_add_fstring(mb,"\t; to %d",(ulong)(iVar19 + 2 + (uVar11 - 0x8000)));
    break;
  case 0x2b:
    if (uVar12 == 0) {
      membuff_add_fstring(mb,"\t; %d",(ulong)pIVar5[iVar19 + 1]);
      iVar19 = iVar19 + 1;
    }
    else {
      membuff_add_fstring(mb,"\t; %d");
    }
    break;
  case 0x2c:
    pcVar13 = "\t; %p";
    pPVar16 = f->p[uVar11];
LAB_0013446e:
    membuff_add_fstring(mb,pcVar13,pPVar16);
    break;
  case 0x2e:
    membuff_add_fstring(mb,"\t; ");
    uVar11 = uVar24;
LAB_001345ef:
    pPVar16 = (Proto *)f->k;
LAB_001345f3:
    PrintConstant(mb,pPVar16,uVar11);
  }
LAB_001345fd:
  membuff_add_fstring(mb,anon_var_dwarf_26f66 + 5);
  iVar19 = iVar19 + 1;
  if (iVar3 <= iVar19) goto LAB_00134660;
  goto LAB_0013415c;
switchD_00134360_caseD_2:
  goto LAB_001345fd;
}

Assistant:

static void ravi_print_function(membuff_t *mb, const Proto* f, int full)
{
  int i, n = f->sizep;
  PrintHeader(mb, f);
  PrintCode(mb, f);
  if (full) PrintDebug(mb, f);
  for (i = 0; i<n; i++) ravi_print_function(mb, f->p[i], full);
}